

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

Pool<A,_8192UL> * __thiscall entityx::EntityManager::accomodate_component<A>(EntityManager *this)

{
  vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *this_00;
  iterator __position;
  long lVar1;
  value_type in_RAX;
  Family FVar2;
  undefined8 *puVar3;
  ulong uVar4;
  char *chunk;
  value_type local_38;
  
  local_38 = in_RAX;
  FVar2 = Component<A>::family();
  this_00 = (vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)(this + 0x18);
  if ((ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18) >> 3) <= FVar2) {
    local_38 = (value_type)0x0;
    Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::resize
              (this_00,FVar2 + 1,&local_38);
  }
  if (*(long *)(*(long *)this_00 + FVar2 * 8) == 0) {
    puVar3 = (undefined8 *)operator_new(0x40);
    puVar3[1] = 0;
    puVar3[2] = 0;
    puVar3[3] = 0;
    puVar3[4] = 1;
    puVar3[5] = 0x2000;
    puVar3[6] = 0;
    puVar3[7] = 0;
    *puVar3 = &PTR__BasePool_001d2d20;
    uVar4 = (ulong)*(uint *)(this + 8);
    if ((ulong)puVar3[7] < uVar4) {
      do {
        local_38 = (value_type)operator_new__(puVar3[5] * puVar3[4]);
        __position._M_current = (char **)puVar3[2];
        if (__position._M_current == (char **)puVar3[3]) {
          std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                    ((vector<char*,std::allocator<char*>> *)(puVar3 + 1),__position,
                     (char **)&local_38);
        }
        else {
          *__position._M_current = (char *)local_38;
          puVar3[2] = puVar3[2] + 8;
        }
        lVar1 = puVar3[7];
        puVar3[7] = lVar1 + puVar3[5];
      } while ((ulong)(lVar1 + puVar3[5]) < uVar4);
    }
    puVar3[6] = uVar4;
    *(undefined8 **)(*(long *)this_00 + FVar2 * 8) = puVar3;
  }
  if ((ulong)(*(long *)(this + 0x38) - *(long *)(this + 0x30) >> 3) <= FVar2) {
    local_38 = (value_type)0x0;
    Catch::clara::std::
    vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>::resize
              ((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                *)(this + 0x30),FVar2 + 1,(value_type *)&local_38);
  }
  lVar1 = *(long *)(this + 0x30);
  if (*(long *)(lVar1 + FVar2 * 8) == 0) {
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = &PTR__BaseComponentHelper_001d2d60;
    *(undefined8 **)(lVar1 + FVar2 * 8) = puVar3;
  }
  return *(Pool<A,_8192UL> **)(*(long *)this_00 + FVar2 * 8);
}

Assistant:

Pool<C> *accomodate_component() {
    BaseComponent::Family family = component_family<C>();
    if (component_pools_.size() <= family) {
      component_pools_.resize(family + 1, nullptr);
    }
    if (!component_pools_[family]) {
      Pool<C> *pool = new Pool<C>();
      pool->expand(index_counter_);
      component_pools_[family] = pool;
    }
    if (component_helpers_.size() <= family) {
      component_helpers_.resize(family + 1, nullptr);
    }
    if (!component_helpers_[family]) {
      ComponentHelper<C> *helper = new ComponentHelper<C>();
      component_helpers_[family] = helper;
    }
    return static_cast<Pool<C>*>(component_pools_[family]);
  }